

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pageReinit(DbPage *pData)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  u32 uVar5;
  uint uVar6;
  MemPage *pPage;
  BtShared *pBVar7;
  u8 *puVar8;
  uint uVar9;
  u16 uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  u8 uVar14;
  uint uVar15;
  undefined8 uVar16;
  ushort uVar17;
  uint uVar18;
  ushort uVar19;
  ulong uVar20;
  
  pPage = (MemPage *)pData->pExtra;
  if ((pPage->isInit == '\0') || (pPage->isInit = '\0', pData->nRef < 2)) {
    return;
  }
  pBVar7 = pPage->pBt;
  puVar8 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  iVar11 = decodeFlags(pPage,(uint)puVar8[bVar1]);
  if (iVar11 == 0) {
    uVar5 = pBVar7->pageSize;
    pPage->maskPage = (short)uVar5 - 1;
    pPage->nOverflow = '\0';
    uVar6 = pBVar7->usableSize;
    bVar2 = pPage->childPtrSize;
    pPage->cellOffset = bVar1 + 8 + (ushort)bVar2;
    pPage->aDataEnd = puVar8 + (int)uVar6;
    pPage->aCellIdx = puVar8 + (ulong)((uint)bVar1 + (uint)bVar2) + 8;
    pPage->aDataOfst = puVar8 + bVar2;
    bVar3 = puVar8[(ulong)bVar1 + 5];
    uVar17 = *(ushort *)(puVar8 + (ulong)bVar1 + 3) << 8 |
             *(ushort *)(puVar8 + (ulong)bVar1 + 3) >> 8;
    bVar4 = puVar8[(ulong)bVar1 + 6];
    pPage->nCell = uVar17;
    if ((uVar5 - 8) / 6 < (uint)uVar17) {
      uVar16 = 0xefd1;
    }
    else {
      lVar13 = (ulong)((uint)bVar1 + (uint)bVar2) + 8;
      uVar15 = (int)lVar13 + (uint)uVar17 * 2;
      iVar11 = uVar6 - 4;
      if ((pBVar7->db->flags & 0x100000) != 0) {
        uVar14 = pPage->leaf;
        if (uVar14 == '\0') {
          iVar11 = uVar6 - 5;
        }
        if (uVar17 != 0) {
          uVar20 = 0;
          do {
            uVar17 = *(ushort *)(puVar8 + uVar20 * 2 + lVar13) << 8 |
                     *(ushort *)(puVar8 + uVar20 * 2 + lVar13) >> 8;
            if ((uVar17 < uVar15) || (iVar11 < (int)(uint)uVar17)) {
              uVar16 = 0xefed;
              goto LAB_002016ae;
            }
            uVar10 = (*pPage->xCellSize)(pPage,puVar8 + (uint)uVar17);
            if ((int)uVar6 < (int)((uint)uVar10 + (uint)uVar17)) {
              uVar16 = 0xeff2;
              goto LAB_002016ae;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < pPage->nCell);
          uVar14 = pPage->leaf;
        }
        iVar11 = iVar11 + (uint)(uVar14 == '\0');
      }
      uVar17 = *(ushort *)(puVar8 + (ulong)bVar1 + 1) << 8 |
               *(ushort *)(puVar8 + (ulong)bVar1 + 1) >> 8;
      iVar12 = (uint)puVar8[(ulong)bVar1 + 7] +
               (((uint)bVar3 * 0x100 + (uint)bVar4) - 1 & 0xffff) + 1;
      if (uVar17 != 0) {
        uVar9 = (uint)uVar17;
        if (uVar17 < uVar15) {
          uVar16 = 0xf004;
          goto LAB_002016ae;
        }
        do {
          uVar18 = uVar9;
          if (iVar11 < (int)uVar18) {
            uVar16 = 0xf009;
            goto LAB_002016ae;
          }
          uVar17 = *(ushort *)(puVar8 + uVar18) << 8 | *(ushort *)(puVar8 + uVar18) >> 8;
          uVar19 = *(ushort *)(puVar8 + (ulong)uVar18 + 2) << 8 |
                   *(ushort *)(puVar8 + (ulong)uVar18 + 2) >> 8;
          iVar12 = iVar12 + (uint)uVar19;
          uVar9 = (uint)uVar17;
        } while (uVar19 + uVar18 + 3 < (uint)uVar17);
        if (uVar17 != 0) {
          uVar16 = 0xf013;
          goto LAB_002016ae;
        }
        if (uVar6 < uVar19 + uVar18) {
          uVar16 = 0xf017;
          goto LAB_002016ae;
        }
      }
      if (iVar12 <= (int)uVar6) {
        pPage->nFree = (short)iVar12 - (short)uVar15;
        pPage->isInit = '\x01';
        return;
      }
      uVar16 = 0xf023;
    }
  }
  else {
    uVar16 = 0xefbe;
  }
LAB_002016ae:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar16,
              "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  return;
}

Assistant:

static void pageReinit(DbPage *pData){
  MemPage *pPage;
  pPage = (MemPage *)sqlite3PagerGetExtra(pData);
  assert( sqlite3PagerPageRefcount(pData)>0 );
  if( pPage->isInit ){
    assert( sqlite3_mutex_held(pPage->pBt->mutex) );
    pPage->isInit = 0;
    if( sqlite3PagerPageRefcount(pData)>1 ){
      /* pPage might not be a btree page;  it might be an overflow page
      ** or ptrmap page or a free page.  In those cases, the following
      ** call to btreeInitPage() will likely return SQLITE_CORRUPT.
      ** But no harm is done by this.  And it is very important that
      ** btreeInitPage() be called on every btree page so we make
      ** the call for every page that comes in for re-initing. */
      btreeInitPage(pPage);
    }
  }
}